

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall
kratos::Stmt::add_scope_variable(Stmt *this,string *name,string *value,bool is_var,bool override)

{
  iterator iVar1;
  undefined3 in_register_00000081;
  undefined1 local_58 [40];
  
  if ((CONCAT31(in_register_00000081,override) == 0) &&
     (iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::find(&(this->scope_context_)._M_t,name),
     (_Rb_tree_header *)iVar1._M_node != &(this->scope_context_)._M_t._M_impl.super__Rb_tree_header)
     ) {
    return;
  }
  local_58[0] = is_var;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)value);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::pair<bool,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<bool,std::__cxx11::string>>>>
              *)&this->scope_context_,name,
             (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 8));
  return;
}

Assistant:

void Stmt::add_scope_variable(const std::string &name, const std::string &value, bool is_var,
                              bool override) {
    if (override || scope_context_.find(name) == scope_context_.end()) {
        scope_context_.emplace(name, std::make_pair(is_var, value));
    }
}